

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O0

_Bool fs_stdio_close_directory(ALLEGRO_FS_ENTRY *fp)

{
  int errnum;
  long in_RDI;
  int rc;
  ALLEGRO_FS_ENTRY_STDIO *fp_stdio;
  int in_stack_ffffffffffffffe4;
  undefined1 local_1;
  
  if (*(long *)(in_RDI + 0xa8) == 0) {
    al_set_errno(in_stack_ffffffffffffffe4);
    local_1 = false;
  }
  else {
    errnum = closedir(*(DIR **)(in_RDI + 0xa8));
    *(undefined8 *)(in_RDI + 0xa8) = 0;
    if (errnum == -1) {
      __errno_location();
      al_set_errno(errnum);
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static bool fs_stdio_close_directory(ALLEGRO_FS_ENTRY *fp)
{
   ALLEGRO_FS_ENTRY_STDIO *fp_stdio = (ALLEGRO_FS_ENTRY_STDIO *) fp;
   int rc;

   if (!fp_stdio->dir) {
      al_set_errno(ENOTDIR);
      return false;
   }

   rc = WRAP_CLOSEDIR(fp_stdio->dir);
   fp_stdio->dir = NULL;
   if (rc == -1) {
      al_set_errno(errno);
      return false;
   }

   return true;
}